

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeStrings(WasmBinaryWriter *this)

{
  Module *pMVar1;
  pointer puVar2;
  Global *pGVar3;
  undefined8 *puVar4;
  pointer puVar5;
  DataSegment *pDVar6;
  pointer pNVar7;
  bool bVar8;
  int32_t iVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  __uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> _Var12;
  undefined8 *puVar13;
  _Base_ptr p_Var14;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar15;
  char **ppcVar16;
  pointer puVar17;
  size_type *psVar18;
  ulong uVar19;
  undefined1 auVar20 [8];
  string_view name;
  undefined1 auStack_298 [8];
  stringstream wtf8;
  ostream local_288 [160];
  pointer local_1e8;
  pointer pTStack_1e0;
  pointer local_1d8;
  Function *pFStack_1d0;
  Module *local_1c8;
  mapped_type *local_1c0;
  undefined1 local_110 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  undefined1 local_b8 [8];
  StringSet allStrings;
  size_t local_78;
  undefined1 auStack_58 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> sorted;
  
  if (((this->wasm->features).features & 0x4000) == 0) {
    __assert_fail("wasm->features.hasStrings()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x1ed,"void wasm::WasmBinaryWriter::writeStrings()");
  }
  analysis._48_8_ = 0;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)local_110,this->wasm,(Func *)&analysis.field_0x30);
  std::_Function_base::~_Function_base((_Function_base *)&analysis.field_0x30);
  auStack_298 = (undefined1  [8])0x0;
  local_1c0 = std::
              map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
              ::operator[]((map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                            *)&analysis,(key_type *)auStack_298);
  auStack_298 = (undefined1  [8])0x0;
  _wtf8 = 0;
  local_1e8 = (pointer)0x0;
  pTStack_1e0 = (pointer)0x0;
  local_1d8 = (pointer)0x0;
  pFStack_1d0 = (Function *)0x0;
  pMVar1 = this->wasm;
  puVar2 = (pMVar1->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c8 = pMVar1;
  for (puVar15 = (pMVar1->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar2; puVar15 = puVar15 + 1
      ) {
    pGVar3 = (puVar15->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
      Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::walk
                ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)auStack_298,
                 &pGVar3->init);
    }
  }
  sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       (pointer)(pMVar1->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar16 = (char **)(pMVar1->elementSegments).
                           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
      (pointer)ppcVar16 !=
      sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage; ppcVar16 = ppcVar16 + 1) {
    _Var12._M_t.
    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
    super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
         (tuple<wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>)*ppcVar16;
    if (*(long *)((long)_Var12._M_t.
                        super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                        .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28)
        != 0) {
      Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::walk
                ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)auStack_298,
                 (Expression **)
                 ((long)_Var12._M_t.
                        super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                        .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28));
      _Var12._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
           (tuple<wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>)*ppcVar16;
    }
    puVar4 = *(undefined8 **)
              ((long)_Var12._M_t.
                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40);
    for (puVar13 = *(undefined8 **)
                    ((long)_Var12._M_t.
                           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x38
                    ); puVar13 != puVar4; puVar13 = puVar13 + 1) {
      local_b8 = (undefined1  [8])*puVar13;
      Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::walk
                ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)auStack_298,
                 (Expression **)local_b8);
    }
  }
  puVar5 = (pMVar1->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar17 = (pMVar1->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar5; puVar17 = puVar17 + 1
      ) {
    pDVar6 = (puVar17->_M_t).
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    if (pDVar6->offset != (Expression *)0x0) {
      Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::walk
                ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)auStack_298,
                 &pDVar6->offset);
    }
  }
  local_1c8 = (Module *)0x0;
  Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::~Walker
            ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)auStack_298);
  local_b8 = (undefined1  [8])&allStrings._M_h._M_rehash_policy._M_next_resize;
  allStrings._M_h._M_buckets = (__buckets_ptr)0x1;
  psVar18 = &allStrings._M_h._M_bucket_count;
  allStrings._M_h._M_bucket_count = 0;
  allStrings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  allStrings._M_h._M_element_count._0_4_ = 0x3f800000;
  allStrings._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  allStrings._M_h._M_rehash_policy._4_4_ = 0;
  allStrings._M_h._M_rehash_policy._M_next_resize = 0;
  for (; (undefined1 *)analysis._24_8_ != &analysis.field_0x8;
      analysis._24_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)analysis._24_8_)) {
    p_Var14 = (_Base_ptr)&((_Rb_tree_node_base *)(analysis._24_8_ + 0x20))->_M_right;
    while (p_Var14 = *(_Base_ptr *)p_Var14, p_Var14 != (_Base_ptr)0x0) {
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_b8,(value_type *)&p_Var14->_M_parent);
    }
  }
  auStack_58 = (undefined1  [8])0x0;
  sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  while (psVar18 = (size_type *)*psVar18, psVar18 != (size_type *)0x0) {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
               (value_type *)(psVar18 + 1));
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (auStack_58,
             sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start);
  uVar19 = 0;
  while( true ) {
    uVar11 = (long)sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)auStack_58 >> 4;
    if (uVar11 <= uVar19) break;
    pmVar10 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->stringIndexes,(key_type *)((long)auStack_58 + uVar19 * 0x10));
    *pmVar10 = (mapped_type)uVar19;
    uVar19 = (ulong)((mapped_type)uVar19 + 1);
  }
  if ((undefined1  [8])
      sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start != auStack_58) {
    iVar9 = startSection<wasm::BinaryConsts::Section>(this,Strings);
    sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iVar9);
    BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x0);
    BufferWithRandomAccess::operator<<(this->o,(U32LEB)(uint)uVar11);
    pNVar7 = sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (auVar20 = auStack_58; auVar20 != (undefined1  [8])pNVar7;
        auVar20 = (undefined1  [8])((long)auVar20 + 0x10)) {
      std::__cxx11::stringstream::stringstream((stringstream *)auStack_298);
      bVar8 = String::convertWTF16ToWTF8(local_288,*(string_view *)auVar20);
      if (!bVar8) {
        __assert_fail("valid",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                      ,0x228,"void wasm::WasmBinaryWriter::writeStrings()");
      }
      std::__cxx11::stringbuf::str();
      name._M_str = (char *)allStrings._M_h._M_single_bucket;
      name._M_len = local_78;
      writeInlineString(this,name);
      std::__cxx11::string::~string((string *)&allStrings._M_h._M_single_bucket);
      std::__cxx11::stringstream::~stringstream((stringstream *)auStack_298);
    }
    finishSection(this,(int32_t)sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
            ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_b8);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
               *)&analysis);
  return;
}

Assistant:

void WasmBinaryWriter::writeStrings() {
  assert(wasm->features.hasStrings());

  // Scan the entire wasm to find the relevant strings.
  // To find all the string literals we must scan all the code.
  using StringSet = std::unordered_set<Name>;

  struct StringWalker : public PostWalker<StringWalker> {
    StringSet& strings;

    StringWalker(StringSet& strings) : strings(strings) {}

    void visitStringConst(StringConst* curr) { strings.insert(curr->string); }
  };

  ModuleUtils::ParallelFunctionAnalysis<StringSet> analysis(
    *wasm, [&](Function* func, StringSet& strings) {
      if (!func->imported()) {
        StringWalker(strings).walk(func->body);
      }
    });

  // Also walk the global module code (for simplicity, also add it to the
  // function map, using a "function" key of nullptr).
  auto& globalStrings = analysis.map[nullptr];
  StringWalker(globalStrings).walkModuleCode(wasm);

  // Generate the indexes from the combined set of necessary strings,
  // which we sort for determinism.
  StringSet allStrings;
  for (auto& [func, strings] : analysis.map) {
    for (auto& string : strings) {
      allStrings.insert(string);
    }
  }
  std::vector<Name> sorted;
  for (auto& string : allStrings) {
    sorted.push_back(string);
  }
  std::sort(sorted.begin(), sorted.end());
  for (Index i = 0; i < sorted.size(); i++) {
    stringIndexes[sorted[i]] = i;
  }

  auto num = sorted.size();
  if (num == 0) {
    return;
  }

  auto start = startSection(BinaryConsts::Section::Strings);

  // Placeholder for future use in the spec.
  o << U32LEB(0);

  // The number of strings and then their contents.
  o << U32LEB(num);
  for (auto& string : sorted) {
    // Re-encode from WTF-16 to WTF-8.
    std::stringstream wtf8;
    [[maybe_unused]] bool valid = String::convertWTF16ToWTF8(wtf8, string.str);
    assert(valid);
    // TODO: Use wtf8.view() once we have C++20.
    writeInlineString(wtf8.str());
  }

  finishSection(start);
}